

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<int,unsigned_int>::emplace_helper<unsigned_int_const&>
          (QHash<int,_unsigned_int> *this,int *key,uint *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<int,_unsigned_int> *n;
  iterator<QHashPrivate::Node<int,_unsigned_int>_> *in_RDX;
  Data<QHashPrivate::Node<int,_unsigned_int>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<int,_unsigned_int>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<int,_unsigned_int>_>::findOrInsert<int>
            (in_RSI,(int *)in_RDX);
  n = QHashPrivate::iterator<QHashPrivate::Node<int,_unsigned_int>_>::node(in_RDX);
  QHashPrivate::Node<int,unsigned_int>::createInPlace<unsigned_int_const&>
            (n,(int *)in_RSI,(uint *)in_RDX);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<int,_unsigned_int>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }